

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall Logger::Impl::Impl(Impl *this,char *fileName,int line)

{
  undefined4 in_EDX;
  allocator<char> *in_RSI;
  char *in_RDI;
  Impl *unaff_retaddr;
  allocator<char> local_15;
  undefined4 local_14;
  char *__s;
  
  local_14 = in_EDX;
  __s = in_RDI;
  memset(in_RDI,0,0xfb0);
  LogStream::LogStream((LogStream *)0x120690);
  *(undefined4 *)(in_RDI + 0xfb0) = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unaff_retaddr,__s,
             in_RSI);
  std::allocator<char>::~allocator(&local_15);
  formatTime(unaff_retaddr);
  return;
}

Assistant:

Logger::Impl::Impl(const char* fileName, int line)
        : stream_(),
        line_(line),
        basename_(fileName){
            formatTime();            
}